

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkTestTimCollectCone(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  int i;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(8000);
  vNodes->pArray = ppvVar2;
  if (pObj == (Abc_Obj_t *)0x0) {
    for (iVar1 = 0; iVar1 < pNtk->vCos->nSize; iVar1 = iVar1 + 1) {
      pAVar3 = Abc_NtkCo(pNtk,iVar1);
      Abc_NtkTestTimCollectCone_rec
                ((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],vNodes);
    }
  }
  else {
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                    ,0xd4,"Vec_Ptr_t *Abc_NtkTestTimCollectCone(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    iVar1 = Abc_NodeIsTravIdCurrent(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Abc_NodeIsTravIdCurrent( pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                    ,0xd5,"Vec_Ptr_t *Abc_NtkTestTimCollectCone(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    Abc_NtkTestTimCollectCone_rec(pObj,vNodes);
    if (vNodes->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    vNodes->nSize = vNodes->nSize + -1;
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkTestTimCollectCone( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    Vec_Ptr_t * vCone = Vec_PtrAlloc( 1000 );
    if ( pObj != NULL )
    {
        // collect for one node
        assert( Abc_ObjIsNode(pObj) );
        assert( !Abc_NodeIsTravIdCurrent( pObj ) );
        Abc_NtkTestTimCollectCone_rec( pObj, vCone );
        // remove the node because it is a white box
        Vec_PtrPop( vCone );
    }
    else
    {
        // collect for all COs
        Abc_Obj_t * pObj;
        int i;
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_NtkTestTimCollectCone_rec( Abc_ObjFanin0(pObj), vCone );
    }
    return vCone;

}